

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O0

void __thiscall DL::DataLisp::build(DataLisp *this,DataContainer *container)

{
  SyntaxTree *this_00;
  SourceLogger *this_01;
  bool bVar1;
  reference ppSVar2;
  undefined1 local_58 [24];
  StatementNode *ptr;
  iterator __end1;
  iterator __begin1;
  vector_t<StatementNode_*> *__range1;
  VM vm;
  DataContainer *container_local;
  DataLisp *this_local;
  
  vm.mLogger = (SourceLogger *)container;
  if (this->mInternal->mTree != (SyntaxTree *)0x0) {
    VM::VM((VM *)&__range1,container,this->mInternal->mLogger);
    this_00 = this->mInternal->mTree;
    __end1 = std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::begin
                       (&this_00->Nodes);
    ptr = (StatementNode *)
          std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::end
                    (&this_00->Nodes);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                                  *)&ptr);
      if (!bVar1) break;
      ppSVar2 = __gnu_cxx::
                __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                ::operator*(&__end1);
      this_01 = vm.mLogger;
      local_58._16_8_ = *ppSVar2;
      DataLisp_Internal::buildGroup
                ((DataLisp_Internal *)local_58,(StatementNode *)this->mInternal,
                 (VM *)local_58._16_8_);
      DataContainer::addTopGroup((DataContainer *)this_01,(DataGroup *)local_58);
      DataGroup::~DataGroup((DataGroup *)local_58);
      __gnu_cxx::
      __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
      ::operator++(&__end1);
    }
    VM::~VM((VM *)&__range1);
    return;
  }
  __assert_fail("(mInternal->mTree)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataLisp.cpp"
                ,0x192,"void DL::DataLisp::build(DataContainer &)");
}

Assistant:

void DataLisp::build(DataContainer& container)
{
	DL_ASSERT(mInternal->mTree);

	VM vm(container, mInternal->mLogger);
	for (StatementNode* ptr : mInternal->mTree->Nodes) {
		container.addTopGroup(mInternal->buildGroup(ptr, vm));
	}
}